

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>_>
* ParseSelfCGroup_abi_cxx11_(void)

{
  char cVar1;
  bool bVar2;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,CGroupSubSys>,std::_Select1st<std::pair<std::__cxx11::string_const,CGroupSubSys>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,CGroupSubSys>>>
  *in_RDI;
  long lVar3;
  ulong uVar4;
  CGroupSubSys subsys;
  string line;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>
  local_298;
  ifstream cgroup;
  byte abStack_218 [488];
  
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,CGroupSubSys>,std::_Select1st<std::pair<std::__cxx11::string_const,CGroupSubSys>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,CGroupSubSys>>>
    **)(in_RDI + 0x18) = in_RDI + 8;
  *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,CGroupSubSys>,std::_Select1st<std::pair<std::__cxx11::string_const,CGroupSubSys>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,CGroupSubSys>>>
    **)(in_RDI + 0x20) = in_RDI + 8;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  std::ifstream::ifstream(&cgroup,"/proc/self/cgroup",_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while ((abStack_218[*(long *)(_cgroup + -0x18)] & 2) == 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&cgroup,(string *)&line);
      subsys.name._M_dataplus._M_p = (pointer)&subsys.name.field_2;
      subsys.name._M_string_length = 0;
      subsys.name.field_2._M_local_buf[0] = '\0';
      subsys.subsystems.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      subsys.subsystems.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      subsys.subsystems.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = CGroupSubSys::parse(&subsys,&line);
      if (bVar2) {
        lVar3 = 0;
        for (uVar4 = 0;
            uVar4 < (ulong)((long)subsys.subsystems.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)subsys.subsystems.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1
            ) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_CGroupSubSys_&,_true>
                    (&local_298,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((subsys.subsystems.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3
                     ),&subsys);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,CGroupSubSys>,std::_Select1st<std::pair<std::__cxx11::string_const,CGroupSubSys>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,CGroupSubSys>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,CGroupSubSys>>(in_RDI,&local_298);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>
          ::~pair(&local_298);
          lVar3 = lVar3 + 0x20;
        }
      }
      CGroupSubSys::~CGroupSubSys(&subsys);
    }
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&cgroup);
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGroupSubSys>_>_>
          *)in_RDI;
}

Assistant:

map<string, CGroupSubSys> ParseSelfCGroup() {
  map<string, CGroupSubSys> cgroups;
  ifstream cgroup("/proc/self/cgroup");
  if (!cgroup.is_open())
    return cgroups;
  string line;
  while (!cgroup.eof()) {
    getline(cgroup, line);
    CGroupSubSys subsys;
    if (!subsys.parse(line))
      continue;
    for (size_t i = 0; i < subsys.subsystems.size(); i++) {
      cgroups.insert(make_pair(subsys.subsystems[i], subsys));
    }
  }
  return cgroups;
}